

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_test.cpp
# Opt level: O2

void LogTest(void)

{
  uint __line;
  Model *this;
  System *s;
  System *t;
  long *plVar1;
  char *__assertion;
  double dVar2;
  allocator local_73;
  allocator local_72;
  allocator local_71;
  string local_70 [32];
  allocator local_50 [32];
  string local_30;
  
  this = (Model *)Model::createModel();
  std::__cxx11::string::string(local_70,"sys1",local_50);
  (**(code **)(*(long *)this + 0x50))(0x4059000000000000,this,local_70);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"sys2",local_50);
  (**(code **)(*(long *)this + 0x50))(0x4024000000000000,this,local_70);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string((string *)&local_30,"exp",&local_71);
  std::__cxx11::string::string(local_70,"sys1",&local_72);
  s = (System *)(**(code **)(*(long *)this + 0x40))(this,local_70);
  std::__cxx11::string::string((string *)local_50,"sys2",&local_73);
  t = (System *)(**(code **)(*(long *)this + 0x40))(this,local_50);
  Model::createFlow<FlowLog>(this,&local_30,s,t);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&local_30);
  (*(code *)**(undefined8 **)this)(this,0,100);
  std::__cxx11::string::string(local_70,"sys1",local_50);
  plVar1 = (long *)(**(code **)(*(long *)this + 0x40))(this,local_70);
  dVar2 = (double)(**(code **)(*plVar1 + 8))(plVar1);
  if (0.0001 <= ABS(dVar2 + -88.2167)) {
    __assertion = "fabs(m->findSystem(\"sys1\")->getValue() - 88.2167) < 0.0001";
    __line = 0x18;
  }
  else {
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::string(local_70,"sys2",local_50);
    plVar1 = (long *)(**(code **)(*(long *)this + 0x40))(this,local_70);
    dVar2 = (double)(**(code **)(*plVar1 + 8))(plVar1);
    if (ABS(dVar2 + -21.7833) < 0.0001) {
      std::__cxx11::string::~string(local_70);
      return;
    }
    __assertion = "fabs(m->findSystem(\"sys2\")->getValue() - 21.7833) < 0.0001";
    __line = 0x19;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                ,__line,"void LogTest()");
}

Assistant:

void LogTest() {
    auto *m = Model::createModel();
    m->createSystem("sys1", 100.0);
     m->createSystem("sys2", 10.0);
    m->createFlow<FlowLog>("exp", m->findSystem("sys1"), m->findSystem("sys2"));
    m->execute(0, 100);

    assert(fabs(m->findSystem("sys1")->getValue() - 88.2167) < 0.0001);
    assert(fabs(m->findSystem("sys2")->getValue() - 21.7833) < 0.0001);
}